

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void sqlite3FkActions(Parse *pParse,Table *pTab,ExprList *pChanges,int regOld,int *aChange,
                     int bChngRowid)

{
  u8 uVar1;
  sqlite3 *db;
  char *__s;
  undefined1 uVar2;
  int iVar3;
  uint uVar4;
  HashElem *pHVar5;
  sColMap *psVar6;
  size_t sVar7;
  Expr *pEVar8;
  Expr *pEVar9;
  Expr *pRight;
  ExprList *pEList;
  SrcList *pSrc;
  Trigger *p;
  Schema *pSVar10;
  Select *pSVar11;
  i16 *piVar12;
  FKey *p_00;
  long lVar13;
  long lVar14;
  uint uVar15;
  long lVar16;
  bool bVar17;
  TriggerStep *local_f0;
  Select *local_e8;
  Expr *local_e0;
  Expr *local_d0;
  ExprList *local_c8;
  int *aiCol;
  int local_9c;
  Token tOld;
  Token tNew;
  Index *pIdx;
  Token tToCol;
  Token tFromCol;
  
  if ((pParse->db->flags & 0x4000) != 0) {
    pHVar5 = findElementWithHash(&pTab->pSchema->fkeyHash,pTab->zName,(uint *)0x0);
    p_00 = (FKey *)pHVar5->data;
    if (p_00 != (FKey *)0x0) {
      bVar17 = pChanges != (ExprList *)0x0;
      local_9c = bChngRowid;
      do {
        if ((aChange == (int *)0x0) ||
           (iVar3 = fkParentIsModified(pTab,p_00,aChange,bChngRowid), iVar3 != 0)) {
          db = pParse->db;
          uVar1 = p_00->aAction[bVar17];
          if ((uVar1 != '\a') || ((db->flags & 0x80000) == 0)) {
            p = p_00->apTrigger[bVar17];
            if ((uVar1 == '\0') || (p != (Trigger *)0x0)) {
              if (p != (Trigger *)0x0) {
LAB_0018e1a0:
                sqlite3CodeRowTriggerDirect(pParse,p,pTab,regOld,2,0);
              }
            }
            else {
              pIdx = (Index *)0x0;
              aiCol = (int *)0x0;
              iVar3 = sqlite3FkLocateIndex(pParse,pTab,p_00,&pIdx,&aiCol);
              if (iVar3 == 0) {
                if (p_00->nCol < 1) {
                  local_e0 = (Expr *)0x0;
                  local_c8 = (ExprList *)0x0;
                  local_d0 = (Expr *)0x0;
                }
                else {
                  lVar14 = 0;
                  lVar16 = 0;
                  lVar13 = 0;
                  local_d0 = (Expr *)0x0;
                  local_c8 = (ExprList *)0x0;
                  local_e0 = (Expr *)0x0;
                  do {
                    tOld.z = "old";
                    tOld.n = 3;
                    tOld._12_4_ = 0;
                    psVar6 = (sColMap *)((long)aiCol + lVar14);
                    if (aiCol == (int *)0x0) {
                      psVar6 = p_00->aCol;
                    }
                    tNew.z = "new";
                    tNew.n = 3;
                    tNew._12_4_ = 0;
                    piVar12 = &pTab->iPKey;
                    if (pIdx != (Index *)0x0) {
                      piVar12 = (i16 *)((long)pIdx->aiColumn + lVar16);
                    }
                    iVar3 = psVar6->iFrom;
                    tToCol.z = pTab->aCol[*piVar12].zName;
                    uVar15 = 0;
                    uVar4 = 0;
                    if (tToCol.z != (char *)0x0) {
                      sVar7 = strlen(tToCol.z);
                      uVar4 = (uint)sVar7 & 0x3fffffff;
                    }
                    tFromCol.z = p_00->pFrom->aCol[iVar3].zName;
                    tToCol.n = uVar4;
                    if (tFromCol.z != (char *)0x0) {
                      sVar7 = strlen(tFromCol.z);
                      uVar15 = (uint)sVar7 & 0x3fffffff;
                    }
                    tFromCol.n = uVar15;
                    pEVar8 = sqlite3ExprAlloc(db,0x3b,&tOld,0);
                    pEVar9 = sqlite3ExprAlloc(db,0x3b,&tToCol,0);
                    pEVar8 = sqlite3PExpr(pParse,0x86,pEVar8,pEVar9);
                    pEVar9 = sqlite3ExprAlloc(db,0x3b,&tFromCol,0);
                    pEVar8 = sqlite3PExpr(pParse,0x35,pEVar8,pEVar9);
                    local_e0 = sqlite3ExprAnd(db,local_e0,pEVar8);
                    if (pChanges != (ExprList *)0x0) {
                      pEVar8 = sqlite3ExprAlloc(db,0x3b,&tOld,0);
                      pEVar9 = sqlite3ExprAlloc(db,0x3b,&tToCol,0);
                      pEVar8 = sqlite3PExpr(pParse,0x86,pEVar8,pEVar9);
                      pEVar9 = sqlite3ExprAlloc(db,0x3b,&tNew,0);
                      pRight = sqlite3ExprAlloc(db,0x3b,&tToCol,0);
                      pEVar9 = sqlite3PExpr(pParse,0x86,pEVar9,pRight);
                      pEVar8 = sqlite3PExpr(pParse,0x2d,pEVar8,pEVar9);
                      local_d0 = sqlite3ExprAnd(db,local_d0,pEVar8);
                    }
                    if ((uVar1 != '\n' || pChanges != (ExprList *)0x0) && uVar1 != '\a') {
                      if (uVar1 == '\t') {
                        pEVar8 = p_00->pFrom->aCol[iVar3].pDflt;
                        if (pEVar8 == (Expr *)0x0) {
                          pEVar8 = (Expr *)sqlite3DbMallocRawNN(db,0x48);
                          if (pEVar8 == (Expr *)0x0) {
                            pEVar8 = (Expr *)0x0;
                          }
                          else {
                            pEVar8->op = '\0';
                            pEVar8->affinity = '\0';
                            *(undefined2 *)&pEVar8->field_0x2 = 0;
                            pEVar8->flags = 0;
                            (pEVar8->u).zToken = (char *)0x0;
                            pEVar8->iColumn = 0;
                            pEVar8->iAgg = 0;
                            pEVar8->iRightJoinTable = 0;
                            pEVar8->op2 = '\0';
                            pEVar8->field_0x37 = 0;
                            pEVar8->pAggInfo = (AggInfo *)0x0;
                            (pEVar8->x).pList = (ExprList *)0x0;
                            pEVar8->nHeight = 0;
                            pEVar8->iTable = 0;
                            pEVar8->pLeft = (Expr *)0x0;
                            pEVar8->pRight = (Expr *)0x0;
                            (pEVar8->y).pTab = (Table *)0x0;
                            pEVar8->op = 'r';
                            pEVar8->iAgg = -1;
                            pEVar8->nHeight = 1;
                          }
                        }
                        else {
                          pEVar8 = exprDup(db,pEVar8,0,(u8 **)0x0);
                        }
                      }
                      else if (uVar1 == '\n') {
                        pEVar8 = sqlite3ExprAlloc(db,0x3b,&tNew,0);
                        pEVar9 = sqlite3ExprAlloc(db,0x3b,&tToCol,0);
                        pEVar8 = sqlite3PExpr(pParse,0x86,pEVar8,pEVar9);
                      }
                      else {
                        pEVar8 = (Expr *)sqlite3DbMallocRawNN(db,0x48);
                        if (pEVar8 == (Expr *)0x0) {
                          pEVar8 = (Expr *)0x0;
                        }
                        else {
                          pEVar8->op = '\0';
                          pEVar8->affinity = '\0';
                          *(undefined2 *)&pEVar8->field_0x2 = 0;
                          pEVar8->flags = 0;
                          (pEVar8->u).zToken = (char *)0x0;
                          pEVar8->iColumn = 0;
                          pEVar8->iAgg = 0;
                          pEVar8->iRightJoinTable = 0;
                          pEVar8->op2 = '\0';
                          pEVar8->field_0x37 = 0;
                          pEVar8->pAggInfo = (AggInfo *)0x0;
                          (pEVar8->x).pList = (ExprList *)0x0;
                          pEVar8->nHeight = 0;
                          pEVar8->iTable = 0;
                          pEVar8->pLeft = (Expr *)0x0;
                          pEVar8->pRight = (Expr *)0x0;
                          (pEVar8->y).pTab = (Table *)0x0;
                          pEVar8->op = 'r';
                          pEVar8->iAgg = -1;
                          pEVar8->nHeight = 1;
                        }
                      }
                      local_c8 = sqlite3ExprListAppend((Parse *)pParse->db,local_c8,pEVar8);
                      sqlite3ExprListSetName(pParse,local_c8,&tFromCol,0);
                    }
                    lVar13 = lVar13 + 1;
                    lVar16 = lVar16 + 2;
                    lVar14 = lVar14 + 4;
                  } while (lVar13 < p_00->nCol);
                }
                if (aiCol != (int *)0x0) {
                  sqlite3DbFreeNN(db,aiCol);
                }
                bChngRowid = local_9c;
                __s = p_00->pFrom->zName;
                if (__s == (char *)0x0) {
                  sVar7 = 0;
                }
                else {
                  sVar7 = strlen(__s);
                  sVar7 = (size_t)((uint)sVar7 & 0x3fffffff);
                }
                if (uVar1 == '\a') {
                  tNew.n = (uint)sVar7;
                  tOld.z = "FOREIGN KEY constraint failed";
                  tOld.n = 0x1d;
                  tNew.z = __s;
                  pEVar8 = sqlite3ExprAlloc(db,0x47,&tOld,0);
                  if (pEVar8 == (Expr *)0x0) {
                    pEList = (ExprList *)sqlite3DbMallocRawNN(pParse->db,0x28);
                    if (pEList == (ExprList *)0x0) {
                      pEList = (ExprList *)0x0;
                    }
                    else {
                      pEList->nExpr = 1;
                      pEList->a[0].pExpr = (Expr *)0x0;
                      pEList->a[0].zName = (char *)0x0;
                      pEList->a[0].zSpan = (char *)0x0;
                      pEList->a[0].sortOrder = '\0';
                      *(undefined3 *)&pEList->a[0].field_0x19 = 0;
                      pEList->a[0].u = (anon_union_4_2_6146edf4_for_u)0x0;
                    }
                  }
                  else {
                    pEVar8->affinity = '\x02';
                    pEList = sqlite3ExprListAppend((Parse *)pParse->db,(ExprList *)0x0,pEVar8);
                  }
                  pSrc = sqlite3SrcListAppend(pParse,(SrcList *)0x0,&tNew,(Token *)0x0);
                  local_e8 = sqlite3SelectNew(pParse,pEList,pSrc,local_e0,(ExprList *)0x0,
                                              (Expr *)0x0,(ExprList *)0x0,0,(Expr *)0x0);
                  local_e0 = (Expr *)0x0;
                }
                else {
                  local_e8 = (Select *)0x0;
                }
                (db->lookaside).bDisable = (db->lookaside).bDisable + 1;
                p = (Trigger *)sqlite3DbMallocZero(db,sVar7 + 0xa1);
                if (p == (Trigger *)0x0) {
                  local_f0 = (TriggerStep *)0x0;
                }
                else {
                  local_f0 = (TriggerStep *)(p + 1);
                  p->step_list = local_f0;
                  p[1].pWhen = (Expr *)&p[2].op;
                  memcpy(&p[2].op,__s,sVar7);
                  if (local_e0 == (Expr *)0x0) {
                    pEVar8 = (Expr *)0x0;
                  }
                  else {
                    pEVar8 = exprDup(db,local_e0,1,(u8 **)0x0);
                  }
                  p[1].pColumns = (IdList *)pEVar8;
                  pSVar10 = (Schema *)sqlite3ExprListDup(db,local_c8,1);
                  p[1].pSchema = pSVar10;
                  pSVar11 = sqlite3SelectDup(db,local_e8,1);
                  *(Select **)&p[1].op = pSVar11;
                  if (local_d0 == (Expr *)0x0) {
                    local_d0 = (Expr *)0x0;
                  }
                  else {
                    local_d0 = sqlite3PExpr(pParse,0x13,local_d0,(Expr *)0x0);
                    pEVar8 = (Expr *)0x0;
                    if (local_d0 != (Expr *)0x0) {
                      pEVar8 = exprDup(db,local_d0,1,(u8 **)0x0);
                    }
                    p->pWhen = pEVar8;
                  }
                }
                (db->lookaside).bDisable = (db->lookaside).bDisable - 1;
                if (local_e0 != (Expr *)0x0) {
                  sqlite3ExprDeleteNN(db,local_e0);
                }
                if (local_d0 != (Expr *)0x0) {
                  sqlite3ExprDeleteNN(db,local_d0);
                }
                if (local_c8 != (ExprList *)0x0) {
                  exprListDeleteNN(db,local_c8);
                }
                if (local_e8 != (Select *)0x0) {
                  clearSelect(db,local_e8,1);
                }
                if (db->mallocFailed != '\x01') {
                  if (uVar1 == '\a') {
                    uVar2 = 0x83;
                  }
                  else if ((uVar1 == '\n') && (pChanges == (ExprList *)0x0)) {
                    uVar2 = 0x79;
                  }
                  else {
                    uVar2 = 0x7a;
                  }
                  local_f0->op = uVar2;
                  local_f0->pTrig = p;
                  pSVar10 = pTab->pSchema;
                  p->pSchema = pSVar10;
                  p->pTabSchema = pSVar10;
                  p_00->apTrigger[bVar17] = p;
                  p->op = bVar17 + 'y';
                  goto LAB_0018e1a0;
                }
                fkTriggerDelete(db,p);
              }
            }
          }
        }
        p_00 = p_00->pNextTo;
      } while (p_00 != (FKey *)0x0);
    }
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3FkActions(
  Parse *pParse,                  /* Parse context */
  Table *pTab,                    /* Table being updated or deleted from */
  ExprList *pChanges,             /* Change-list for UPDATE, NULL for DELETE */
  int regOld,                     /* Address of array containing old row */
  int *aChange,                   /* Array indicating UPDATEd columns (or 0) */
  int bChngRowid                  /* True if rowid is UPDATEd */
){
  /* If foreign-key support is enabled, iterate through all FKs that 
  ** refer to table pTab. If there is an action associated with the FK 
  ** for this operation (either update or delete), invoke the associated 
  ** trigger sub-program.  */
  if( pParse->db->flags&SQLITE_ForeignKeys ){
    FKey *pFKey;                  /* Iterator variable */
    for(pFKey = sqlite3FkReferences(pTab); pFKey; pFKey=pFKey->pNextTo){
      if( aChange==0 || fkParentIsModified(pTab, pFKey, aChange, bChngRowid) ){
        Trigger *pAct = fkActionTrigger(pParse, pTab, pFKey, pChanges);
        if( pAct ){
          sqlite3CodeRowTriggerDirect(pParse, pAct, pTab, regOld, OE_Abort, 0);
        }
      }
    }
  }
}